

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::metrics::MetricsTest_testReset_Test::TestBody(MetricsTest_testReset_Test *this)

{
  bool bVar1;
  pointer pMVar2;
  Counter *pCVar3;
  char *pcVar4;
  Gauge *pGVar5;
  AssertionResult local_1e0 [2];
  AssertHelper local_1c0 [8];
  Message local_1b8 [15];
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_178 [8];
  Message local_170 [15];
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_130 [8];
  Message local_128 [15];
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  Message local_100 [8];
  size_type local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  ValueMap *timers;
  string local_c8;
  char *local_a8;
  char *timerName;
  int64_t time;
  Message local_90 [8];
  size_type local_88;
  int local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  ValueMap *gauges;
  AssertHelper local_58 [8];
  Message local_50 [24];
  size_type local_38;
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  ValueMap *counters;
  MetricsTest_testReset_Test *this_local;
  
  pMVar2 = std::
           unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
           ::operator->(&(this->super_MetricsTest)._metrics);
  pCVar3 = Metrics::tracesStartedSampled(pMVar2);
  (*pCVar3->_vptr_Counter[2])(pCVar3,1);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       InMemoryStatsReporter::counters_abi_cxx11_(&(this->super_MetricsTest)._metricsReporter);
  local_2c = 1;
  local_38 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)gtest_ar.message_.ptr_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_28,"1","counters.size()",&local_2c,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=(local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    pMVar2 = std::
             unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
             ::operator->(&(this->super_MetricsTest)._metrics);
    pGVar5 = Metrics::reporterQueueLength(pMVar2);
    (*pGVar5->_vptr_Gauge[2])(pGVar5,1);
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InMemoryStatsReporter::gauges_abi_cxx11_(&(this->super_MetricsTest)._metricsReporter);
    local_7c = 1;
    local_88 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                       *)gtest_ar_1.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((EqHelper<false> *)local_78,"1","gauges.size()",&local_7c,&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
    if (!bVar1) {
      testing::Message::Message(local_90);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&time,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                 ,0x60,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&time,local_90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&time);
      testing::Message::~Message(local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
    if (bVar1) {
      timerName = (char *)0x1;
      local_a8 = "jaeger.test-timer";
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c8,"jaeger.test-timer",(allocator *)((long)&timers + 7));
      StatsReporter::recordTimer
                ((StatsReporter *)&(this->super_MetricsTest)._metricsReporter,&local_c8,1);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&timers + 7));
      gtest_ar_2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           InMemoryStatsReporter::timers_abi_cxx11_(&(this->super_MetricsTest)._metricsReporter);
      local_ec = 1;
      local_f8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)gtest_ar_2.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((EqHelper<false> *)local_e8,"1","timers.size()",&local_ec,&local_f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar1) {
        testing::Message::Message(local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                   ,0x66,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        testing::Message::~Message(local_100);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      if (bVar1) {
        jaegertracing::metrics::InMemoryStatsReporter::reset();
        local_119 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                    ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                             *)gtest_ar.message_.ptr_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_118,&local_119,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)&gtest_ar__1.message_,local_118,"counters.empty()","false");
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                     ,0x69,pcVar4);
          testing::internal::AssertHelper::operator=(local_130,local_128);
          testing::internal::AssertHelper::~AssertHelper(local_130);
          std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
          testing::Message::~Message(local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          local_161 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                               *)gtest_ar_1.message_.ptr_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_160,&local_161,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
          if (!bVar1) {
            testing::Message::Message(local_170);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)&gtest_ar__2.message_,local_160,"gauges.empty()","false");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (local_178,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                       ,0x6a,pcVar4);
            testing::internal::AssertHelper::operator=(local_178,local_170);
            testing::internal::AssertHelper::~AssertHelper(local_178);
            std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
            testing::Message::~Message(local_170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
          if (bVar1) {
            local_1a9 = std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                        ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                                 *)gtest_ar_2.message_.ptr_);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
            if (!bVar1) {
              testing::Message::Message(local_1b8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (local_1e0,local_1a8,"timers.empty()","false");
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (local_1c0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/metrics/MetricsTest.cpp"
                         ,0x6b,pcVar4);
              testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
              testing::internal::AssertHelper::~AssertHelper(local_1c0);
              std::__cxx11::string::~string((string *)local_1e0);
              testing::Message::~Message(local_1b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(MetricsTest, testReset)
{
    _metrics->tracesStartedSampled().inc(1);
    const auto& counters = _metricsReporter.counters();
    ASSERT_EQ(1, counters.size());

    _metrics->reporterQueueLength().update(1);
    const auto& gauges = _metricsReporter.gauges();
    ASSERT_EQ(1, gauges.size());

    constexpr auto time = static_cast<int64_t>(1);
    constexpr auto timerName = "jaeger.test-timer";
    _metricsReporter.recordTimer(timerName, time);
    const auto& timers = _metricsReporter.timers();
    ASSERT_EQ(1, timers.size());

    _metricsReporter.reset();
    ASSERT_TRUE(counters.empty());
    ASSERT_TRUE(gauges.empty());
    ASSERT_TRUE(timers.empty());
}